

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O3

void __thiscall NaPNKalman::allocate_resources(NaPNKalman *this)

{
  NaDataFile *pNVar1;
  
  NaVector::new_dim(&this->x,this->n);
  NaVector::new_dim(&this->x_extra,this->n);
  NaMatrix::new_dim(&this->P_tilde,this->n,this->n);
  NaMatrix::new_dim(&this->P_extra,this->n,this->n);
  if ((this->super_NaPetriNode).bVerbose == true) {
    pNVar1 = OpenOutputDataFile("K.dat",bdtAuto,0);
    this->dfK = pNVar1;
    pNVar1 = OpenOutputDataFile("P_tilde.dat",bdtAuto,0);
  }
  else {
    this->dfK = (NaDataFile *)0x0;
    pNVar1 = (NaDataFile *)0x0;
  }
  this->dfP_tilde = pNVar1;
  return;
}

Assistant:

void
NaPNKalman::allocate_resources ()
{
    // Allocate internal buffers
    x.new_dim(n);
    x_extra.new_dim(n);

    P_tilde.new_dim(n, n);
    P_extra.new_dim(n, n);

    if(bVerbose){
        dfK = OpenOutputDataFile("K.dat");
        dfP_tilde = OpenOutputDataFile("P_tilde.dat");
    }else{
        dfK = NULL;
        dfP_tilde = NULL;
    }
}